

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void search_switchable(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                      RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  WienerInfo *wiener_info;
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  RestorationType r;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  
  lVar1 = *(long *)((long)priv + 0x18);
  lVar2 = *(long *)((long)priv + 0x30);
  wiener_info = (WienerInfo *)(lVar2 + (long)rest_unit_idx * 0x40);
  iVar13 = *(int *)((long)priv + 0x20);
  uVar11 = 0;
  dVar15 = 0.0;
  lVar12 = 0;
  uVar14 = 0;
  do {
    if ((uVar11 == 0) || (*(long *)((long)priv + uVar11 * 8 + 0x60) <= *(long *)((long)priv + 0x60))
       ) {
      lVar3 = *(long *)((long)priv + uVar11 * 8 + 0x60);
      if ((int)uVar11 == 0) {
        uVar10 = uVar11 & 0xffffffff;
      }
      else if ((int)uVar11 == 2) {
        iVar8 = count_sgrproj_bits((SgrprojInfo *)(lVar2 + (long)rest_unit_idx * 0x40 + 0x20),
                                   (SgrprojInfo *)((long)priv + 0x110));
        uVar10 = (ulong)iVar8;
      }
      else {
        iVar8 = count_wiener_bits((uint)(iVar13 == 0) * 2 + 5,wiener_info,
                                  (WienerInfo *)((long)priv + 0xf0));
        uVar10 = (ulong)iVar8;
      }
      lVar9 = (long)*(int *)(lVar1 + 0xb930 + uVar11 * 4) + uVar10 * 0x200;
      dVar4 = (double)(lVar3 >> (*(char *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48)
                                 * '\x02' - 0x10U & 0x3f)) * 128.0 +
              (double)*(int *)(lVar1 + 0x4218) * (double)(lVar9 >> 4) * 0.001953125;
      if ((uVar11 == 2) && (*(int *)wiener_info[1].vfilter < 10)) {
        dVar4 = dVar4 * ((double)*(int *)(*(long *)((long)priv + 0x38) + 0x14) * 0.01 + 1.0);
      }
      if (dVar4 < dVar15 || uVar11 == 0) {
        uVar14 = uVar11 & 0xffffffff;
        lVar12 = lVar9;
        dVar15 = dVar4;
      }
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  iVar13 = (int)uVar14;
  *(int *)(wiener_info[1].hfilter + 2) = iVar13;
  *(long *)((long)priv + 0x98) =
       *(long *)((long)priv + 0x98) + *(long *)((long)priv + uVar14 * 8 + 0x60);
  *(long *)((long)priv + 0xb8) = *(long *)((long)priv + 0xb8) + lVar12;
  if (iVar13 == 1) {
    uVar5 = *(undefined8 *)wiener_info->vfilter;
    uVar6 = *(undefined8 *)(wiener_info->vfilter + 4);
    uVar7 = *(undefined8 *)(wiener_info->hfilter + 4);
    *(undefined8 *)((long)priv + 0x100) = *(undefined8 *)wiener_info->hfilter;
    *(undefined8 *)((long)priv + 0x108) = uVar7;
    *(undefined8 *)((long)priv + 0xf0) = uVar5;
    *(undefined8 *)((long)priv + 0xf8) = uVar6;
  }
  else if (iVar13 == 2) {
    *(undefined4 *)((long)priv + 0x118) = *(undefined4 *)(wiener_info[1].vfilter + 4);
    *(undefined8 *)((long)priv + 0x110) = *(undefined8 *)wiener_info[1].vfilter;
  }
  return;
}

Assistant:

static inline void search_switchable(
    const RestorationTileLimits *limits, int rest_unit_idx, void *priv,
    int32_t *tmpbuf, RestorationLineBuffers *rlbs,
    struct aom_internal_error_info *error_info) {
  (void)limits;
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;

  const int wiener_win =
      (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN : WIENER_WIN_CHROMA;

  double best_cost = 0;
  int64_t best_bits = 0;
  RestorationType best_rtype = RESTORE_NONE;

  for (RestorationType r = 0; r < RESTORE_SWITCHABLE_TYPES; ++r) {
    // If this restoration mode was skipped, or could not find a solution
    // that was better than RESTORE_NONE, then we can't select it here either.
    //
    // Note: It is possible for the restoration search functions to find a
    // filter which is better than RESTORE_NONE when looking purely at SSE, but
    // for it to be rejected overall due to its rate cost. In this case, there
    // is a chance that it may be have a lower rate cost when looking at
    // RESTORE_SWITCHABLE, and so it might be acceptable here.
    //
    // Therefore we prune based on SSE, rather than on whether or not the
    // previous search function selected this mode.
    if (r > RESTORE_NONE) {
      if (rsc->sse[r] > rsc->sse[RESTORE_NONE]) continue;
    }

    const int64_t sse = rsc->sse[r];
    int64_t coeff_pcost = 0;
    switch (r) {
      case RESTORE_NONE: coeff_pcost = 0; break;
      case RESTORE_WIENER:
        coeff_pcost = count_wiener_bits(wiener_win, &rusi->wiener,
                                        &rsc->switchable_ref_wiener);
        break;
      case RESTORE_SGRPROJ:
        coeff_pcost =
            count_sgrproj_bits(&rusi->sgrproj, &rsc->switchable_ref_sgrproj);
        break;
      default: assert(0); break;
    }
    const int64_t coeff_bits = coeff_pcost << AV1_PROB_COST_SHIFT;
    const int64_t bits = x->mode_costs.switchable_restore_cost[r] + coeff_bits;
    double cost = RDCOST_DBL_WITH_NATIVE_BD_DIST(
        x->rdmult, bits >> 4, sse, rsc->cm->seq_params->bit_depth);
    if (r == RESTORE_SGRPROJ && rusi->sgrproj.ep < 10)
      cost *= (1 + DUAL_SGR_PENALTY_MULT * rsc->lpf_sf->dual_sgr_penalty_level);
    if (r == 0 || cost < best_cost) {
      best_cost = cost;
      best_bits = bits;
      best_rtype = r;
    }
  }

  rusi->best_rtype[RESTORE_SWITCHABLE - 1] = best_rtype;

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_SWITCHABLE][rsc->plane][rest_unit_idx].wiener_info =
      rsc->switchable_ref_wiener;
  lr_ref_params[RESTORE_SWITCHABLE][rsc->plane][rest_unit_idx].sgrproj_info =
      rsc->switchable_ref_sgrproj;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_SWITCHABLE] += rsc->sse[best_rtype];
  rsc->total_bits[RESTORE_SWITCHABLE] += best_bits;
  if (best_rtype == RESTORE_WIENER) rsc->switchable_ref_wiener = rusi->wiener;
  if (best_rtype == RESTORE_SGRPROJ)
    rsc->switchable_ref_sgrproj = rusi->sgrproj;
}